

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-accel.c
# Opt level: O3

void fy_accel_entry_remove(fy_accel *xl,fy_accel_entry *xle)

{
  fy_accel_entry *input;
  uint uVar1;
  list_head *plVar2;
  list_head *plVar3;
  
  if (xle == (fy_accel_entry *)0x0 || xl == (fy_accel *)0x0) {
    return;
  }
  input = xle + 1;
  uVar1 = xl->hd->size;
  switch(uVar1) {
  case 1:
    break;
  case 2:
    if (((ulong)input & 1) != 0) {
      __assert_fail("!((uintptr_t) hash & 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-accel.c"
                    ,0x2f,
                    "unsigned int fy_accel_hash_to_pos(struct fy_accel *, const void *, unsigned int)"
                   );
    }
    break;
  default:
    XXH32(input,(ulong)uVar1,0);
    break;
  case 4:
    if (((ulong)input & 3) != 0) {
      __assert_fail("!((uintptr_t) hash & 3)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-accel.c"
                    ,0x33,
                    "unsigned int fy_accel_hash_to_pos(struct fy_accel *, const void *, unsigned int)"
                   );
    }
    break;
  case 8:
    if (((ulong)input & 7) != 0) {
      __assert_fail("!((uintptr_t) hash & 7)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-accel.c"
                    ,0x37,
                    "unsigned int fy_accel_hash_to_pos(struct fy_accel *, const void *, unsigned int)"
                   );
    }
  }
  if (xl->buckets != (fy_accel_entry_list *)0x0) {
    plVar2 = (xle->node).next;
    plVar3 = (xle->node).prev;
    plVar2->prev = plVar3;
    plVar3->next = plVar2;
    (xle->node).next = &xle->node;
    (xle->node).prev = &xle->node;
  }
  if (xl->count != 0) {
    xl->count = xl->count - 1;
    free(xle);
    return;
  }
  __assert_fail("xl->count > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-accel.c"
                ,0x115,"void fy_accel_entry_remove(struct fy_accel *, struct fy_accel_entry *)");
}

Assistant:

void
fy_accel_entry_remove(struct fy_accel *xl, struct fy_accel_entry *xle) {
    unsigned int pos;

    if (!xl || !xle)
        return;

    pos = fy_accel_hash_to_pos(xl, xle->hash, xl->nbuckets);

    fy_accel_entry_list_del(&xl->buckets[pos], xle);

    assert(xl->count > 0);
    xl->count--;

    free(xle);
}